

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cpp
# Opt level: O0

PAL_ERROR CorUnix::InternalOpenEvent
                    (CPalThread *pthr,DWORD dwDesiredAccess,BOOL bInheritHandle,LPCWSTR lpName,
                    HANDLE *phEvent)

{
  undefined1 local_48 [8];
  CPalString sObjectName;
  IPalObject *pobjEvent;
  PAL_ERROR palError;
  HANDLE *phEvent_local;
  LPCWSTR lpName_local;
  BOOL bInheritHandle_local;
  DWORD dwDesiredAccess_local;
  CPalThread *pthr_local;
  
  sObjectName.m_dwStringLength = 0;
  sObjectName.m_dwMaxLength = 0;
  CPalString::CPalString((CPalString *)local_48,lpName);
  if (pthr == (CPalThread *)0x0) {
    fprintf(_stderr,"] %s %s:%d","InternalOpenEvent",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchobj/event.cpp"
            ,0x21b);
    fprintf(_stderr,"Expression: NULL != pthr\n");
  }
  if (lpName == (LPCWSTR)0x0) {
    fprintf(_stderr,"] %s %s:%d","InternalOpenEvent",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchobj/event.cpp"
            ,0x21c);
    fprintf(_stderr,"Expression: NULL != lpName\n");
  }
  if (phEvent == (HANDLE *)0x0) {
    fprintf(_stderr,"] %s %s:%d","InternalOpenEvent",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchobj/event.cpp"
            ,0x21d);
    fprintf(_stderr,"Expression: NULL != phEvent\n");
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
    pobjEvent._4_4_ =
         (**(code **)(*g_pObjectManager + 0x10))
                   (g_pObjectManager,pthr,local_48,&aotEvent,&sObjectName.m_dwStringLength);
    if (pobjEvent._4_4_ == 0) {
      pobjEvent._4_4_ =
           (**(code **)(*g_pObjectManager + 0x18))
                     (g_pObjectManager,pthr,sObjectName._8_8_,dwDesiredAccess,bInheritHandle != 0,0,
                      phEvent);
    }
    if (sObjectName._8_8_ != 0) {
      (**(code **)(*(long *)sObjectName._8_8_ + 0x40))(sObjectName._8_8_,pthr);
    }
    if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
      return pobjEvent._4_4_;
    }
    abort();
  }
  abort();
}

Assistant:

PAL_ERROR
CorUnix::InternalOpenEvent(
    CPalThread *pthr,
    DWORD dwDesiredAccess,
    BOOL bInheritHandle,
    LPCWSTR lpName,
    HANDLE *phEvent
    )
{
    PAL_ERROR palError = NO_ERROR;
    IPalObject *pobjEvent = NULL;
    CPalString sObjectName(lpName);

    _ASSERTE(NULL != pthr);
    _ASSERTE(NULL != lpName);
    _ASSERTE(NULL != phEvent);

    ENTRY("InternalOpenEvent(pthr=%p, dwDesiredAccess=%#x, bInheritHandle=%d, "
        "lpName=%p, phEvent=%p)\n",
        pthr,
        dwDesiredAccess,
        bInheritHandle,
        lpName,
        phEvent
        );

    palError = g_pObjectManager->LocateObject(
        pthr,
        &sObjectName,
        &aotEvent,
        &pobjEvent
        );

    if (NO_ERROR != palError)
    {
        goto InternalOpenEventExit;
    }

    palError = g_pObjectManager->ObtainHandleForObject(
        pthr,
        pobjEvent,
        dwDesiredAccess,
        bInheritHandle,
        NULL,
        phEvent
        );

    if (NO_ERROR != palError)
    {
        goto InternalOpenEventExit;
    }

InternalOpenEventExit:

    if (NULL != pobjEvent)
    {
        pobjEvent->ReleaseReference(pthr);
    }

    LOGEXIT("InternalOpenEvent returns %d\n", palError);
    
    return palError;
}